

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::HasImportLibrary(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  TargetType TVar4;
  ManagedType MVar5;
  cmValue cVar6;
  bool bVar7;
  string_view value;
  size_type __dnew;
  pointer local_50;
  string local_48;
  
  iVar3 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
  bVar7 = true;
  if ((char)iVar3 != '\0') {
    paVar1 = &local_48.field_2;
    local_50 = (pointer)0x29;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    local_48._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
    local_48.field_2._M_allocated_capacity = (size_type)local_50;
    builtin_strncpy(local_48._M_dataplus._M_p,"XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS",0x29);
    local_48._M_string_length = (size_type)local_50;
    local_50[(long)local_48._M_dataplus._M_p] = '\0';
    cVar6 = GetProperty(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1))
      ;
    }
    if (cVar6.Value == (string *)0x0) {
      this_00 = this->Makefile;
      local_50 = (pointer)0x2f;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      local_48._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
      local_48.field_2._M_allocated_capacity = (size_type)local_50;
      builtin_strncpy((char *)((long)&((string *)local_48._M_dataplus._M_p)->field_2 + 0xf),
                      "TEXT_BAS",8);
      builtin_strncpy((char *)((long)&(((string *)((long)local_48._M_dataplus._M_p + 0x20))->
                                      _M_dataplus)._M_p + 7),"ED_STUBS",8);
      (((string *)local_48._M_dataplus._M_p)->field_2)._M_allocated_capacity = 0x45475f4554554249;
      builtin_strncpy((char *)((long)&((string *)local_48._M_dataplus._M_p)->field_2 + 8),"NERATE_T"
                      ,8);
      (((string *)local_48._M_dataplus._M_p)->_M_dataplus)._M_p = (pointer)0x43585f454b414d43;
      ((string *)local_48._M_dataplus._M_p)->_M_string_length = 0x525454415f45444f;
      local_48._M_string_length = (size_type)local_50;
      local_50[(long)&((string *)local_48._M_dataplus._M_p)->_M_dataplus] = '\0';
      cVar6 = cmMakefile::GetDefinition(this_00,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,
                        (ulong)(local_48.field_2._M_allocated_capacity + 1));
      }
      if (cVar6.Value == (string *)0x0) goto LAB_00613d71;
    }
    value._M_str = "YES";
    value._M_len = 3;
    local_48._M_dataplus._M_p = (pointer)cVar6.Value;
    iVar3 = cmValue::Compare((cmValue *)&local_48,value);
    bVar7 = iVar3 == 0;
  }
LAB_00613d71:
  bVar2 = cmTarget::IsDLLPlatform(this->Target);
  if ((bVar2) &&
     (((TVar4 = cmTarget::GetType(this->Target), TVar4 == SHARED_LIBRARY ||
       (bVar2 = cmTarget::IsExecutableWithExports(this->Target), bVar2)) &&
      (MVar5 = GetManagedType(this,config), MVar5 != Managed)))) {
    return true;
  }
  bVar2 = cmTarget::IsAIX(this->Target);
  if ((bVar2) && (bVar2 = cmTarget::IsExecutableWithExports(this->Target), bVar2)) {
    return true;
  }
  bVar2 = cmMakefile::PlatformSupportsAppleTextStubs(this->Makefile);
  if (bVar2) {
    bVar2 = cmTarget::IsSharedLibraryWithExports(this->Target);
    bVar7 = (bool)(bVar7 & bVar2);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmGeneratorTarget::HasImportLibrary(std::string const& config) const
{
  bool generate_Stubs = true;
  if (this->GetGlobalGenerator()->IsXcode()) {
    // take care of CMAKE_XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS variable
    // as well as XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS property
    if (cmValue propGenStubs =
          this->GetProperty("XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS")) {
      generate_Stubs = propGenStubs == "YES";
    } else if (cmValue varGenStubs = this->Makefile->GetDefinition(
                 "CMAKE_XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS")) {
      generate_Stubs = varGenStubs == "YES";
    }
  }

  return (this->IsDLLPlatform() &&
          (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
           this->IsExecutableWithExports()) &&
          // Assemblies which have only managed code do not have
          // import libraries.
          this->GetManagedType(config) != ManagedType::Managed) ||
    (this->IsAIX() && this->IsExecutableWithExports()) ||
    (this->Makefile->PlatformSupportsAppleTextStubs() &&
     this->IsSharedLibraryWithExports() && generate_Stubs);
}